

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

int32_t icu_63::number::impl::CurrencySpacingEnabledModifier::applyCurrencySpacingAffix
                  (NumberStringBuilder *output,int32_t index,EAffix affix,
                  DecimalFormatSymbols *symbols,UErrorCode *status)

{
  UBool UVar1;
  UChar32 local_160;
  UChar32 local_148;
  Field local_144;
  undefined1 local_140 [8];
  UnicodeString spacingString;
  UnicodeSet numberUniset;
  int numberCp;
  undefined1 local_90 [8];
  UnicodeSet affixUniset;
  int affixCp;
  Field affixField;
  UErrorCode *status_local;
  DecimalFormatSymbols *symbols_local;
  EAffix affix_local;
  int32_t index_local;
  NumberStringBuilder *output_local;
  
  if (affix == PREFIX) {
    local_144 = NumberStringBuilder::fieldAt(output,index + -1);
  }
  else {
    local_144 = NumberStringBuilder::fieldAt(output,index);
  }
  affixUniset._84_4_ = local_144;
  if (local_144 == UNUM_CURRENCY_FIELD) {
    if (affix == PREFIX) {
      local_148 = NumberStringBuilder::codePointBefore(output,index);
    }
    else {
      local_148 = NumberStringBuilder::codePointAt(output,index);
    }
    affixUniset._80_4_ = local_148;
    getUnicodeSet((UnicodeSet *)local_90,symbols,IN_CURRENCY,affix,status);
    UVar1 = UnicodeSet::contains((UnicodeSet *)local_90,affixUniset._80_4_);
    if (UVar1 == '\0') {
      output_local._4_4_ = 0;
    }
    else {
      if (affix == PREFIX) {
        local_160 = NumberStringBuilder::codePointAt(output,index);
      }
      else {
        local_160 = NumberStringBuilder::codePointBefore(output,index);
      }
      getUnicodeSet((UnicodeSet *)((long)&spacingString.fUnion + 0x30),symbols,IN_NUMBER,affix,
                    status);
      UVar1 = UnicodeSet::contains((UnicodeSet *)((long)&spacingString.fUnion + 0x30),local_160);
      if (UVar1 == '\0') {
        output_local._4_4_ = 0;
      }
      else {
        getInsertString((UnicodeString *)local_140,symbols,affix,status);
        output_local._4_4_ =
             NumberStringBuilder::insert
                       (output,index,(UnicodeString *)local_140,UNUM_FIELD_COUNT,status);
        UnicodeString::~UnicodeString((UnicodeString *)local_140);
      }
      UnicodeSet::~UnicodeSet((UnicodeSet *)((long)&spacingString.fUnion + 0x30));
    }
    UnicodeSet::~UnicodeSet((UnicodeSet *)local_90);
  }
  else {
    output_local._4_4_ = 0;
  }
  return output_local._4_4_;
}

Assistant:

int32_t
CurrencySpacingEnabledModifier::applyCurrencySpacingAffix(NumberStringBuilder &output, int32_t index,
                                                          EAffix affix,
                                                          const DecimalFormatSymbols &symbols,
                                                          UErrorCode &status) {
    // NOTE: For prefix, output.fieldAt(index-1) gets the last field type in the prefix.
    // This works even if the last code point in the prefix is 2 code units because the
    // field value gets populated to both indices in the field array.
    Field affixField = (affix == PREFIX) ? output.fieldAt(index - 1) : output.fieldAt(index);
    if (affixField != UNUM_CURRENCY_FIELD) {
        return 0;
    }
    int affixCp = (affix == PREFIX) ? output.codePointBefore(index) : output.codePointAt(index);
    UnicodeSet affixUniset = getUnicodeSet(symbols, IN_CURRENCY, affix, status);
    if (!affixUniset.contains(affixCp)) {
        return 0;
    }
    int numberCp = (affix == PREFIX) ? output.codePointAt(index) : output.codePointBefore(index);
    UnicodeSet numberUniset = getUnicodeSet(symbols, IN_NUMBER, affix, status);
    if (!numberUniset.contains(numberCp)) {
        return 0;
    }
    UnicodeString spacingString = getInsertString(symbols, affix, status);

    // NOTE: This next line *inserts* the spacing string, triggering an arraycopy.
    // It would be more efficient if this could be done before affixes were attached,
    // so that it could be prepended/appended instead of inserted.
    // However, the build code path is more efficient, and this is the most natural
    // place to put currency spacing in the non-build code path.
    // TODO: Should we use the CURRENCY field here?
    return output.insert(index, spacingString, UNUM_FIELD_COUNT, status);
}